

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void __thiscall
LZ77Compressor::DefaultEncode::operator()
          (DefaultEncode *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,Item item)

{
  ulong in_RDX;
  value_type_conflict1 *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  uint8_t b2;
  uint8_t b1;
  
  if ((in_RDX & 1) == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(in_RDI,in_RSI);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(in_RDI,in_RSI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void operator()(std::vector<uint8_t>& out, Item item) {
			if (item.isRepeat) {
				uint8_t b1 = item.length | ((item.offset >> 4) & 0xF0);
				uint8_t b2 = item.offset & 0xFF;
				if (isSwitch) {
					b1 = (b1 >> 4) | (b1 << 4);
				}
				out.push_back(b1);
				out.push_back(b2);
			} else {
				out.push_back(item.value);
			}
		}